

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool local_79;
  uint local_78;
  int model;
  UndoHistory history;
  Cmd cmd2;
  Cmd cmd1;
  
  model = 0;
  cmd1.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  cmd1.m_redo_value = 1;
  cmd1.m_undo_value = 0;
  cmd2.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  cmd2.m_redo_value = 2;
  cmd2.m_undo_value = 1;
  history._vptr_UndoHistory._0_4_ = 0;
  cmd2.m_model = &model;
  cmd1.m_model = &model;
  expect_eq<int,int>((int *)&history,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x14);
  model = 1;
  history._vptr_UndoHistory._0_4_ = model;
  expect_eq<int,int>((int *)&history,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x16);
  model = 2;
  history._vptr_UndoHistory._0_4_ = model;
  expect_eq<int,int>((int *)&history,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x18);
  undo::UndoHistory::UndoHistory(&history,(UndoHistoryDelegate *)0x0);
  local_78 = local_78 & 0xffffff00;
  local_79 = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1b)
  ;
  local_78 = local_78 & 0xffffff00;
  local_79 = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1c)
  ;
  undo::UndoHistory::add(&history,&cmd1.super_UndoCommand);
  local_78._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1e)
  ;
  local_78._0_1_ = false;
  local_79 = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1f)
  ;
  undo::UndoHistory::add(&history,&cmd2.super_UndoCommand);
  local_78._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x21)
  ;
  local_78 = (uint)local_78._1_3_ << 8;
  local_79 = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x22)
  ;
  undo::UndoHistory::undo(&history);
  local_78 = 1;
  expect_eq<int,int>((int *)&local_78,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x25);
  local_78._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x26)
  ;
  local_78 = CONCAT31(local_78._1_3_,1);
  local_79 = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x27)
  ;
  undo::UndoHistory::undo(&history);
  local_78 = 0;
  expect_eq<int,int>((int *)&local_78,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x29);
  local_78 = local_78 & 0xffffff00;
  local_79 = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2a)
  ;
  local_78 = CONCAT31(local_78._1_3_,1);
  local_79 = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2b)
  ;
  undo::UndoHistory::redo(&history);
  local_78 = 1;
  expect_eq<int,int>((int *)&local_78,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x2e);
  local_78._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2f)
  ;
  local_78 = CONCAT31(local_78._1_3_,1);
  local_79 = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x30)
  ;
  undo::UndoHistory::redo(&history);
  local_78 = 2;
  expect_eq<int,int>((int *)&local_78,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x32);
  local_78._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x33)
  ;
  local_78 = (uint)local_78._1_3_ << 8;
  local_79 = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x34)
  ;
  undo::UndoHistory::~UndoHistory(&history);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);

  EXPECT_EQ(0, model);
  cmd1.redo();
  EXPECT_EQ(1, model);
  cmd2.redo();
  EXPECT_EQ(2, model);

  UndoHistory history;
  EXPECT_FALSE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
  history.add(&cmd1);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
  history.add(&cmd2);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());

  history.undo();
  EXPECT_EQ(1, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_TRUE(history.canRedo());
  history.undo();
  EXPECT_EQ(0, model);
  EXPECT_FALSE(history.canUndo());
  EXPECT_TRUE(history.canRedo());

  history.redo();
  EXPECT_EQ(1, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_TRUE(history.canRedo());
  history.redo();
  EXPECT_EQ(2, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
}